

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_zlib_inflate_table(uchar *codes,size_t codes_len,uint16_t *zdebug_table,uint16_t *table)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  uint16_t uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint16_t uStack_e8;
  ushort local_e6 [3];
  uint16_t start [16];
  uint16_t prev [16];
  ushort auStack_9e [4];
  uint16_t firstcode [7];
  uint16_t uStack_78;
  ushort auStack_76 [3];
  uint16_t count [16];
  
  _uStack_78 = 0;
  count[0] = 0;
  count[1] = 0;
  count[2] = 0;
  count[3] = 0;
  count[4] = 0;
  count[5] = 0;
  count[6] = 0;
  count[7] = 0;
  count[8] = 0;
  count[9] = 0;
  count[10] = 0;
  count[0xb] = 0;
  if (codes_len != 0) {
    sVar10 = 0;
    do {
      bVar2 = codes[sVar10];
      uVar24 = (ulong)bVar2;
      if (0xf < uVar24) {
        return 0;
      }
      uVar12 = (uint16_t)sVar10;
      if (count[uVar24 - 4] == 0) {
        *(uint16_t *)((long)&uStack_e8 + (ulong)((uint)bVar2 + (uint)bVar2)) = uVar12;
        *(uint16_t *)((long)start + (ulong)((uint)bVar2 + (uint)bVar2) + 0x18) = uVar12;
        uVar12 = 1;
      }
      else {
        zdebug_table[(ulong)start[uVar24 + 0xc] + 0x800] = uVar12;
        uVar24 = (ulong)codes[sVar10];
        uVar17 = (ulong)((uint)codes[sVar10] * 2);
        *(uint16_t *)((long)start + uVar17 + 0x18) = uVar12;
        uVar12 = *(short *)((long)count + (uVar17 - 8)) + 1;
      }
      count[uVar24 - 4] = uVar12;
      sVar10 = sVar10 + 1;
    } while (codes_len != sVar10);
  }
  memset(table,0,0x800);
  lVar13 = 1;
  uVar16 = 0;
  do {
    uVar3 = count[lVar13 + -4];
    if (uVar3 != 0) {
      uVar7 = 1 << ((byte)lVar13 & 0x1f);
      uVar22 = (uint)uVar3;
      if (uVar7 < uVar22) {
        return 0;
      }
      uVar19 = (uint)local_e6[lVar13 + -1];
      uVar21 = 1 << ((byte)(lVar13 + -1) & 0x1f);
      uVar24 = 0;
      do {
        uVar17 = (ulong)uVar16;
        if (0x1ff < uVar19) {
          return 0;
        }
        if (uVar16 < 0x100) {
          do {
            if (table[uVar17] != 0) {
              return 0;
            }
            table[uVar17] = (short)(lVar13 + -1) * 0x200 | (ushort)uVar19;
            uVar17 = uVar17 + uVar7;
          } while (uVar17 < 0x100);
        }
        uVar24 = uVar24 + 1;
        uVar6 = uVar21;
        if (uVar24 < uVar22) {
          uVar19 = (uint)zdebug_table[(ulong)uVar19 + 0x800];
        }
        do {
          uVar15 = uVar6;
          uVar6 = uVar15 >> 1;
        } while ((uVar15 & uVar16) != 0);
        uVar16 = (uVar15 - 1 & uVar16) + uVar15;
        if (uVar15 == 0) {
          uVar16 = 0;
        }
      } while (uVar24 != uVar22);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 9);
  lVar13 = 9;
  do {
    uVar7 = (uint)count[lVar13 + -4];
    if (count[lVar13 + -4] != 0) {
      prev[lVar13 + 8] = (uint16_t)uVar16;
      lVar8 = 0;
      do {
        if ((uVar7 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
          uVar22 = 1 << ((char)(lVar13 - lVar8) - 1U & 0x1f);
          uVar24 = 1;
          do {
            if ((uVar22 & uVar16) == 0) {
              uVar16 = uVar16 + uVar22;
              break;
            }
            uVar16 = uVar16 & ~uVar22;
            uVar22 = uVar22 >> 1;
            bVar5 = uVar24 < (ulong)(lVar13 - lVar8);
            uVar24 = (ulong)((int)uVar24 + 1);
          } while (bVar5);
          uVar7 = uVar7 & ~(1 << ((byte)lVar8 & 0x1f));
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar13);
      if (uVar7 != 0) {
        return 0;
      }
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 0x10) {
      uVar24 = 0xf;
      uVar17 = 0;
      do {
        uVar20 = (ulong)count[uVar24 - 4];
        if (uVar20 != 0) {
          uVar23 = (ulong)local_e6[uVar24 - 1];
          uVar25 = (ulong)prev[uVar24 + 8];
          uVar1 = uVar24 - 8;
          uVar7 = 1 << ((byte)uVar1 & 0x1f);
          uVar3 = (short)uVar1 * 0x200;
          uVar16 = 1 << ((char)uVar24 - 1U & 0x1f);
          uVar27 = 0x100;
          uVar14 = 0;
          uVar11 = 0;
          uVar18 = 0;
          uVar26 = uVar17;
          do {
            uVar9 = uVar25 & 0xff;
            uVar17 = uVar26;
            if (uVar27 != uVar9) {
              uVar4 = table[uVar9];
              uVar27 = uVar9;
              if (uVar4 == 0) {
                if (0x1ff < uVar26) {
                  return 0;
                }
                table[uVar9] = ((ushort)uVar26 | uVar3) + 0x1000;
                uVar11 = uVar1;
                uVar17 = uVar26 + (long)(int)uVar7;
                uVar18 = uVar26;
              }
              else {
                if ((uVar4 >> 0xc & 1) == 0) {
                  return 0;
                }
                uVar11 = (ulong)(uVar4 >> 9 & 7);
                if (uVar11 < uVar1) {
                  return 0;
                }
                uVar18 = (ulong)(uVar4 & 0x1ff);
              }
            }
            uVar26 = uVar25 >> 8;
            uVar22 = 1 << ((byte)uVar11 & 0x1f);
            if ((uint)(uVar25 >> 8) < uVar22) {
              do {
                if (table[uVar18 + uVar26 + 0x100] != 0) {
                  return 0;
                }
                table[uVar18 + uVar26 + 0x100] = uVar3 | (ushort)uVar23;
                uVar26 = uVar26 + uVar7;
              } while (uVar26 < uVar22);
            }
            uVar14 = uVar14 + 1;
            uVar22 = uVar16;
            if (uVar14 < uVar20) {
              uVar23 = (ulong)zdebug_table[uVar23 + 0x800];
            }
            do {
              uVar19 = uVar22;
              uVar22 = uVar19 >> 1;
            } while ((uVar19 & (uint)uVar25) != 0);
            uVar22 = (uVar19 - 1 & (uint)uVar25) + uVar19;
            if (uVar19 == 0) {
              uVar22 = 0;
            }
            uVar25 = (ulong)uVar22;
            uVar26 = uVar17;
          } while (uVar14 != uVar20);
        }
        uVar24 = uVar24 - 1;
        if (uVar24 < 9) {
          return 1;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

static int
elf_zlib_inflate_table (unsigned char *codes, size_t codes_len,
			uint16_t *zdebug_table, uint16_t *table)
{
  uint16_t count[16];
  uint16_t start[16];
  uint16_t prev[16];
  uint16_t firstcode[7];
  uint16_t *next;
  size_t i;
  size_t j;
  unsigned int code;
  size_t next_secondary;

  /* Count the number of code of each length.  Set NEXT[val] to be the
     next value after VAL with the same bit length.  */

  next = (uint16_t *) (((unsigned char *) zdebug_table)
		       + ZLIB_TABLE_WORK_OFFSET);

  memset (&count[0], 0, 16 * sizeof (uint16_t));
  for (i = 0; i < codes_len; ++i)
    {
      if (unlikely (codes[i] >= 16))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      if (count[codes[i]] == 0)
	{
	  start[codes[i]] = i;
	  prev[codes[i]] = i;
	}
      else
	{
	  next[prev[codes[i]]] = i;
	  prev[codes[i]] = i;
	}

      ++count[codes[i]];
    }

  /* For each length, fill in the table for the codes of that
     length.  */

  memset (table, 0, ZLIB_HUFFMAN_TABLE_SIZE * sizeof (uint16_t));

  /* Handle the values that do not require a secondary table.  */

  code = 0;
  for (j = 1; j <= 8; ++j)
    {
      unsigned int jcnt;
      unsigned int val;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      if (unlikely (jcnt > (1U << j)))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      /* There are JCNT values that have this length, the values
	 starting from START[j] continuing through NEXT[VAL].  Those
	 values are assigned consecutive values starting at CODE.  */

      val = start[j];
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  /* In the compressed bit stream, the value VAL is encoded as
	     J bits with the value C.  */

	  if (unlikely ((val & ~ZLIB_HUFFMAN_VALUE_MASK) != 0))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  tval = val | ((j - 1) << ZLIB_HUFFMAN_BITS_SHIFT);

	  /* The table lookup uses 8 bits.  If J is less than 8, we
	     don't know what the other bits will be.  We need to fill
	     in all possibilities in the table.  Since the Huffman
	     code is unambiguous, those entries can't be used for any
	     other code.  */

	  for (ind = code; ind < 0x100; ind += 1 << j)
	    {
	      if (unlikely (table[ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[ind] = tval;
	    }

	  /* Advance to the next value with this length.  */
	  if (i + 1 < jcnt)
	    val = next[val];

	  /* The Huffman codes are stored in the bitstream with the
	     most significant bit first, as is required to make them
	     unambiguous.  The effect is that when we read them from
	     the bitstream we see the bit sequence in reverse order:
	     the most significant bit of the Huffman code is the least
	     significant bit of the value we read from the bitstream.
	     That means that to make our table lookups work, we need
	     to reverse the bits of CODE.  Since reversing bits is
	     tedious and in general requires using a table, we instead
	     increment CODE in reverse order.  That is, if the number
	     of bits we are currently using, here named J, is 3, we
	     count as 000, 100, 010, 110, 001, 101, 011, 111, which is
	     to say the numbers from 0 to 7 but with the bits
	     reversed.  Going to more bits, aka incrementing J,
	     effectively just adds more zero bits as the beginning,
	     and as such does not change the numeric value of CODE.

	     To increment CODE of length J in reverse order, find the
	     most significant zero bit and set it to one while
	     clearing all higher bits.  In other words, add 1 modulo
	     2^J, only reversed.  */

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

  /* Handle the values that require a secondary table.  */

  /* Set FIRSTCODE, the number at which the codes start, for each
     length.  */

  for (j = 9; j < 16; j++)
    {
      unsigned int jcnt;
      unsigned int k;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      /* There are JCNT values that have this length, the values
	 starting from START[j].  Those values are assigned
	 consecutive values starting at CODE.  */

      firstcode[j - 9] = code;

      /* Reverse add JCNT to CODE modulo 2^J.  */
      for (k = 0; k < j; ++k)
	{
	  if ((jcnt & (1U << k)) != 0)
	    {
	      unsigned int m;
	      unsigned int bit;

	      bit = 1U << (j - k - 1);
	      for (m = 0; m < j - k; ++m, bit >>= 1)
		{
		  if ((code & bit) == 0)
		    {
		      code += bit;
		      break;
		    }
		  code &= ~bit;
		}
	      jcnt &= ~(1U << k);
	    }
	}
      if (unlikely (jcnt != 0))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
    }

  /* For J from 9 to 15, inclusive, we store COUNT[J] consecutive
     values starting at START[J] with consecutive codes starting at
     FIRSTCODE[J - 9].  In the primary table we need to point to the
     secondary table, and the secondary table will be indexed by J - 9
     bits.  We count down from 15 so that we install the larger
     secondary tables first, as the smaller ones may be embedded in
     the larger ones.  */

  next_secondary = 0; /* Index of next secondary table (after primary).  */
  for (j = 15; j >= 9; j--)
    {
      unsigned int jcnt;
      unsigned int val;
      size_t primary; /* Current primary index.  */
      size_t secondary; /* Offset to current secondary table.  */
      size_t secondary_bits; /* Bit size of current secondary table.  */

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      val = start[j];
      code = firstcode[j - 9];
      primary = 0x100;
      secondary = 0;
      secondary_bits = 0;
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  if ((code & 0xff) != primary)
	    {
	      uint16_t tprimary;

	      /* Fill in a new primary table entry.  */

	      primary = code & 0xff;

	      tprimary = table[primary];
	      if (tprimary == 0)
		{
		  /* Start a new secondary table.  */

		  if (unlikely ((next_secondary & ZLIB_HUFFMAN_VALUE_MASK)
				!= next_secondary))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }

		  secondary = next_secondary;
		  secondary_bits = j - 8;
		  next_secondary += 1 << secondary_bits;
		  table[primary] = (secondary
				    + ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT)
				    + (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT));
		}
	      else
		{
		  /* There is an existing entry.  It had better be a
		     secondary table with enough bits.  */
		  if (unlikely ((tprimary
				 & (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT))
				== 0))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		  secondary = tprimary & ZLIB_HUFFMAN_VALUE_MASK;
		  secondary_bits = ((tprimary >> ZLIB_HUFFMAN_BITS_SHIFT)
				    & ZLIB_HUFFMAN_BITS_MASK);
		  if (unlikely (secondary_bits < j - 8))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		}
	    }

	  /* Fill in secondary table entries.  */

	  tval = val | ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT);

	  for (ind = code >> 8;
	       ind < (1U << secondary_bits);
	       ind += 1U << (j - 8))
	    {
	      if (unlikely (table[secondary + 0x100 + ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[secondary + 0x100 + ind] = tval;
	    }

	  if (i + 1 < jcnt)
	    val = next[val];

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

#ifdef BACKTRACE_GENERATE_FIXED_HUFFMAN_TABLE
  final_next_secondary = next_secondary;
#endif

  return 1;
}